

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::Clear(Value_BlobFileValue *this)

{
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->filename_);
  this->offset_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value_BlobFileValue::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Value.BlobFileValue)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  filename_.ClearToEmpty();
  offset_ = uint64_t{0u};
  _internal_metadata_.Clear<std::string>();
}